

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void test_handshake(ptls_iovec_t ticket,int mode,int expect_ticket,int check_ch,
                   int require_client_authentication)

{
  char *pcVar1;
  ptls_buffer_t *ppVar2;
  ptls_context_t *ppVar3;
  int iVar4;
  int iVar5;
  ptls_t *ppVar6;
  ptls_t *tls;
  undefined8 uVar7;
  uint uVar8;
  size_t sVar9;
  bool bVar10;
  size_t consumed;
  int local_c1bc;
  ptls_t *local_c1b8;
  ptls_buffer_t local_c1b0;
  ptls_buffer_t local_c190;
  int local_c16c;
  ulong local_c168;
  size_t max_early_data_size;
  ptls_buffer_t local_c158;
  undefined1 local_c138 [104];
  ptls_raw_extension_t *ppStack_c0d0;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *local_c0c8;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *p_Stack_c0c0;
  ptls_handshake_properties_t server_hs_prop;
  uint8_t decbuf_small [16384];
  uint8_t sbuf_small [16384];
  uint8_t cbuf_small [16384];
  
  ppVar3 = ctx;
  local_c138._24_8_ = ticket.len;
  local_c138._16_8_ = ticket.base;
  local_c0c8 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0;
  p_Stack_c0c0 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *
                 )0x0;
  local_c138._96_8_ = 0;
  ppStack_c0d0 = (ptls_raw_extension_t *)0x0;
  local_c138._80_8_ = (uint8_t *)0x0;
  local_c138._88_8_ = 0;
  local_c138._64_8_ = 0;
  local_c138._72_8_ = (void *)0x0;
  local_c138._48_8_ = (uint8_t *)0x0;
  local_c138._56_8_ = 0;
  local_c138._32_8_ = (size_t *)0x0;
  local_c138._40_8_ = 0;
  local_c138._0_8_ = (ptls_iovec_t *)0x0;
  local_c138._8_8_ = 0;
  server_hs_prop.collect_extension =
       (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0;
  server_hs_prop.collected_extensions =
       (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)0x0;
  server_hs_prop.field_0._96_8_ = 0;
  server_hs_prop.additional_extensions = (ptls_raw_extension_t *)0x0;
  server_hs_prop.field_0.server.cookie.additional_data.base = (uint8_t *)0x0;
  server_hs_prop.field_0.server.cookie.additional_data.len = 0;
  server_hs_prop.field_0.server.selected_psk_binder.len = 0;
  server_hs_prop.field_0.server.cookie.key = (void *)0x0;
  server_hs_prop.field_0.client.esni_keys.base = (uint8_t *)0x0;
  server_hs_prop.field_0.client.esni_keys.len = 0;
  server_hs_prop.field_0.client.max_early_data_size = (size_t *)0x0;
  server_hs_prop.field_0._40_8_ = 0;
  max_early_data_size = 0;
  server_hs_prop.field_0.client.session_ticket.base = (uint8_t *)0x0;
  server_hs_prop.field_0.client.session_ticket.len = 0;
  server_hs_prop.field_0.client.negotiated_protocols.list = (ptls_iovec_t *)0x0;
  server_hs_prop.field_0.client.negotiated_protocols.count = 0;
  if (check_ch != 0) {
    ctx->verify_certificate = verify_certificate;
  }
  ppVar6 = ptls_client_new(ppVar3);
  tls = ptls_server_new(ctx_peer);
  local_c1b0.off = 0;
  local_c1b0.is_allocated = 0;
  local_c190.off = 0;
  local_c190.is_allocated = 0;
  local_c158.off = 0;
  local_c158.is_allocated = 0;
  local_c1b0.base = cbuf_small;
  local_c1b0.capacity = 0x4000;
  local_c190.base = sbuf_small;
  local_c190.capacity = 0x4000;
  local_c158.base = decbuf_small;
  local_c158.capacity = 0x4000;
  if (check_ch != 0) {
    ctx_peer->on_client_hello = &test_handshake::cb;
    local_c138._0_8_ = test_handshake::protocols;
    local_c138._8_8_ = 2;
    ptls_set_server_name(ppVar6,"test.example.com",0);
  }
  ppVar3 = ctx_peer;
  ctx_peer->on_extension = &test_handshake::cb_1;
  if (require_client_authentication != 0) {
    ppVar3->field_0x70 = ppVar3->field_0x70 | 8;
  }
  if (ppVar3->esni != (ptls_esni_context_t **)0x0) {
    was_esni = 0;
    local_c138._48_8_ = anon_var_dwarf_ac2a;
    local_c138._56_8_ = 0x72;
  }
  local_c1bc = check_ch;
  local_c168 = (ulong)(uint)mode;
  if (mode == 4) {
    if (ppVar3->max_early_data_size == 0) {
      __assert_fail("ctx_peer->max_early_data_size != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                    ,0x264,"void test_handshake(ptls_iovec_t, int, int, int, int)");
    }
    local_c138._32_8_ = &max_early_data_size;
  }
  else if (mode == 3) {
    local_c138._40_8_ = local_c138._40_8_ | 0x100000000;
    server_hs_prop.field_0.server.cookie.key = anon_var_dwarf_ddf6;
    server_hs_prop.field_0._96_8_ = server_hs_prop.field_0._96_8_ | 2;
  }
  else if (mode == 2) {
    local_c138._40_8_ = local_c138._40_8_ | 0x100000000;
  }
  iVar4 = ptls_handshake(ppVar6,&local_c1b0,(void *)0x0,(size_t *)0x0,
                         (ptls_handshake_properties_t *)local_c138);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x26a)
  ;
  _ok((uint)(local_c1b0.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x26b)
  ;
  iVar4 = (int)local_c168;
  local_c1b8 = ppVar6;
  if (iVar4 - 1U < 3) {
    consumed = local_c1b0.off;
    iVar5 = ptls_handshake(tls,&local_c190,local_c1b0.base,&consumed,&server_hs_prop);
    if (iVar4 == 3) {
      _ok((uint)(iVar5 == 0x206),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
          0x274);
      ptls_free(tls);
      tls = ptls_server_new(ctx_peer);
    }
    else {
      _ok((uint)(iVar5 == 0x202),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
          0x278);
    }
    _ok((uint)(local_c1b0.off == consumed),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x27a);
    _ok((uint)(local_c190.off != 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x27b);
    local_c1b0.off = 0;
    consumed = local_c190.off;
    iVar4 = ptls_handshake(local_c1b8,&local_c1b0,local_c190.base,&consumed,
                           (ptls_handshake_properties_t *)local_c138);
    _ok((uint)(iVar4 == 0x202),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x27f);
    _ok((uint)(local_c190.off == consumed),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x280);
    _ok((uint)(local_c1b0.off != 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x281);
    local_c190.off = 0;
  }
  else if (iVar4 == 4) {
    _ok((uint)(max_early_data_size == ctx_peer->max_early_data_size),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x285);
    iVar4 = ptls_send(ppVar6,&local_c1b0,"GET / HTTP/1.0\r\n\r\n",0x12);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x287);
  }
  consumed = local_c1b0.off;
  iVar4 = ptls_handshake(tls,&local_c190,local_c1b0.base,&consumed,&server_hs_prop);
  if (require_client_authentication == 1) {
    _ok((uint)((tls->field_0x160 & 2) == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x28f);
    uVar7 = 0x290;
    iVar5 = 0x202;
  }
  else {
    uVar7 = 0x292;
    iVar5 = 0;
  }
  uVar8 = 0;
  _ok((uint)(iVar4 == iVar5),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",uVar7)
  ;
  _ok((uint)(local_c190.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x295)
  ;
  iVar4 = local_c1bc;
  if (local_c1bc == 0) {
    _ok((uint)(tls->server_name == (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x29d);
    bVar10 = tls->negotiated_protocol == (char *)0x0;
    uVar7 = 0x29e;
  }
  else {
    _ok((uint)(tls->server_name != (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x297);
    iVar5 = strcmp(tls->server_name,"test.example.com");
    _ok((uint)(iVar5 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x298);
    _ok((uint)(tls->negotiated_protocol != (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x299);
    pcVar1 = tls->negotiated_protocol;
    if ((*pcVar1 == 'h') && (pcVar1[1] == '2')) {
      uVar8 = (uint)(pcVar1[2] == '\0');
    }
    _ok(uVar8,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x29a);
    bVar10 = was_esni == (uint)(ctx_peer->esni != (ptls_esni_context_t **)0x0);
    uVar7 = 0x29b;
  }
  local_c16c = expect_ticket;
  _ok((uint)bVar10,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",uVar7)
  ;
  sVar9 = consumed;
  if ((int)local_c168 == 4 && require_client_authentication == 0) {
    _ok((uint)(consumed < local_c1b0.off),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2a2);
    memmove(local_c1b0.base,local_c1b0.base + sVar9,local_c1b0.off - sVar9);
    consumed = local_c1b0.off - sVar9;
    local_c1b0.off = consumed;
    iVar4 = ptls_receive(tls,&local_c158,local_c1b0.base,&consumed);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2a8);
    _ok((uint)(consumed == local_c1b0.off),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2a9);
    sVar9 = local_c158.off;
    _ok((uint)(local_c158.off == 0x12),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2aa);
    iVar4 = bcmp(local_c158.base,"GET / HTTP/1.0\r\n\r\n",sVar9);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2ab);
    _ok((uint)(tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2ac);
    iVar4 = local_c1bc;
    local_c1b0.off = 0;
    local_c158.off = 0;
    iVar5 = ptls_send(tls,&local_c190,"HTTP/1.0 200 OK\r\n\r\nhello world\n",0x1f);
    _ok((uint)(iVar5 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2b1);
  }
  else {
    _ok((uint)(consumed == local_c1b0.off),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2b3);
    local_c1b0.off = 0;
  }
  ppVar6 = local_c1b8;
  consumed = local_c190.off;
  uVar8 = 0;
  iVar5 = ptls_handshake(local_c1b8,&local_c1b0,local_c190.base,&consumed,
                         (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar5 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2b9)
  ;
  _ok((uint)(local_c1b0.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2ba)
  ;
  if (iVar4 == 0) {
    _ok((uint)(tls->server_name == (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2c1);
    _ok((uint)(tls->negotiated_protocol == (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2c2);
    iVar4 = local_c16c;
  }
  else {
    _ok((uint)(ppVar6->server_name != (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",700)
    ;
    iVar4 = strcmp(ppVar6->server_name,"test.example.com");
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2bd);
    _ok((uint)(ppVar6->negotiated_protocol != (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2be);
    iVar4 = local_c16c;
    pcVar1 = ppVar6->negotiated_protocol;
    if ((*pcVar1 == 'h') && (pcVar1[1] == '2')) {
      uVar8 = (uint)(pcVar1[2] == '\0');
    }
    _ok(uVar8,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2bf);
  }
  sVar9 = consumed;
  if (iVar4 == 0) {
    sVar9 = 0;
    _ok((uint)(consumed == local_c190.off),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2ca);
  }
  else {
    _ok((uint)(consumed < local_c190.off),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2c6);
    memmove(local_c190.base,local_c190.base + sVar9,local_c190.off - sVar9);
    sVar9 = local_c190.off - sVar9;
  }
  local_c190.off = sVar9;
  if (require_client_authentication == 1) {
    _ok((uint)(tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2cf);
    consumed = local_c1b0.off;
    iVar4 = ptls_handshake(tls,&local_c190,local_c1b0.base,&consumed,&server_hs_prop);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2d2);
    _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2d3);
    local_c1b0.off = 0;
LAB_0011be80:
    iVar4 = ptls_send(ppVar6,&local_c1b0,"GET / HTTP/1.0\r\n\r\n",0x12);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2d9);
    consumed = local_c1b0.off;
    iVar4 = ptls_receive(tls,&local_c158,local_c1b0.base,&consumed);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2dd);
    _ok((uint)(consumed == local_c1b0.off),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2de);
    _ok((uint)(local_c158.off == 0x12),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2df);
    iVar4 = bcmp(local_c158.base,"GET / HTTP/1.0\r\n\r\n",0x12);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2e0);
    _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2e1);
    local_c158.off = 0;
    local_c1b0.off = 0;
    iVar4 = ptls_send(tls,&local_c190,"HTTP/1.0 200 OK\r\n\r\nhello world\n",0x1f);
    ppVar6 = local_c1b8;
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2e6);
  }
  else if ((int)local_c168 != 4) goto LAB_0011be80;
  consumed = local_c190.off;
  iVar4 = ptls_receive(ppVar6,&local_c158,local_c190.base,&consumed);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2eb)
  ;
  _ok((uint)(consumed == local_c190.off),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2ec)
  ;
  _ok((uint)(local_c158.off == 0x1f),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2ed)
  ;
  iVar4 = bcmp(local_c158.base,"HTTP/1.0 200 OK\r\n\r\nhello world\n",0x1f);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2ee)
  ;
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar6->state),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x2ef)
  ;
  local_c158.off = 0;
  local_c190.off = 0;
  if ((int)local_c168 == 4) {
    ppVar2 = &local_c1b0;
    consumed = local_c1b0.off;
    iVar4 = ptls_receive(tls,&local_c158,local_c1b0.base,&consumed);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2f6);
    ppVar6 = local_c1b8;
    _ok((uint)(local_c1b0.off == consumed),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2f7);
    _ok((uint)(local_c158.off == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2f8);
    _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar6->state),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x2f9);
    iVar4 = local_c1bc;
  }
  else {
    iVar4 = local_c1bc;
    if ((int)local_c168 != 5) goto LAB_0011c473;
    ppVar2 = &local_c158;
    ptls_update_key(tls,1);
    _ok(1,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x300);
    _ok(*(uint *)&tls->field_0x160 >> 3 & 1,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x301);
    _ok(*(uint *)&tls->field_0x160 >> 4 & 1,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x302);
    iVar4 = ptls_send(tls,&local_c190,"good bye",8);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x304);
    _ok((uint)((tls->field_0x160 & 8) == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x305);
    _ok((uint)((tls->field_0x160 & 0x10) == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x306);
    consumed = local_c190.off;
    iVar4 = ptls_receive(local_c1b8,&local_c158,local_c190.base,&consumed);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x309);
    _ok((uint)(local_c190.off == consumed),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x30a);
    _ok((uint)(local_c158.off == 8),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x30b);
    _ok((uint)(*(long *)local_c158.base == 0x65796220646f6f67),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x30c);
    _ok(*(uint *)&local_c1b8->field_0x160 >> 3 & 1,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x30d);
    _ok((uint)((local_c1b8->field_0x160 & 0x10) == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x30e);
    local_c190.off = 0;
    local_c158.off = 0;
    iVar4 = ptls_send(local_c1b8,&local_c1b0,"hello",5);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x312);
    consumed = local_c1b0.off;
    iVar4 = ptls_receive(tls,&local_c158,local_c1b0.base,&consumed);
    _ok((uint)(iVar4 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x315);
    _ok((uint)(local_c1b0.off == consumed),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x316);
    _ok((uint)(local_c158.off == 5),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x317);
    iVar5 = bcmp(local_c158.base,"hello",5);
    ppVar6 = local_c1b8;
    iVar4 = local_c1bc;
    _ok((uint)(iVar5 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x318);
    local_c1b0.off = 0;
  }
  ppVar2->off = 0;
LAB_0011c473:
  ptls_buffer_dispose(&local_c1b0);
  ptls_buffer_dispose(&local_c190);
  ptls_buffer_dispose(&local_c158);
  ptls_free(ppVar6);
  ptls_free(tls);
  if (iVar4 != 0) {
    ctx_peer->on_client_hello = (ptls_on_client_hello_t *)0x0;
  }
  ctx->verify_certificate = (ptls_verify_certificate_t *)0x0;
  if (require_client_authentication != 0) {
    ctx_peer->field_0x70 = ctx_peer->field_0x70 & 0xf7;
  }
  return;
}

Assistant:

static void test_handshake(ptls_iovec_t ticket, int mode, int expect_ticket, int check_ch, int require_client_authentication)
{
    ptls_t *client, *server;
    ptls_handshake_properties_t client_hs_prop = {{{{NULL}, ticket}}}, server_hs_prop = {{{{NULL}}}};
    uint8_t cbuf_small[16384], sbuf_small[16384], decbuf_small[16384];
    ptls_buffer_t cbuf, sbuf, decbuf;
    size_t consumed, max_early_data_size = 0;
    int ret;
    const char *req = "GET / HTTP/1.0\r\n\r\n";
    const char *resp = "HTTP/1.0 200 OK\r\n\r\nhello world\n";

    if (check_ch)
        ctx->verify_certificate = verify_certificate;

    client = ptls_new(ctx, 0);
    server = ptls_new(ctx_peer, 1);
    ptls_buffer_init(&cbuf, cbuf_small, sizeof(cbuf_small));
    ptls_buffer_init(&sbuf, sbuf_small, sizeof(sbuf_small));
    ptls_buffer_init(&decbuf, decbuf_small, sizeof(decbuf_small));

    if (check_ch) {
        static ptls_on_client_hello_t cb = {save_client_hello};
        ctx_peer->on_client_hello = &cb;
        static const ptls_iovec_t protocols[] = {{(uint8_t *)"h2", 2}, {(uint8_t *)"http/1.1", 8}};
        client_hs_prop.client.negotiated_protocols.list = protocols;
        client_hs_prop.client.negotiated_protocols.count = PTLS_ELEMENTSOF(protocols);
        ptls_set_server_name(client, "test.example.com", 0);
    }

    static ptls_on_extension_t cb = {on_extension_cb};
    ctx_peer->on_extension = &cb;

    if (require_client_authentication) {
        ctx_peer->require_client_authentication = 1;
    }

    if (ctx_peer->esni != NULL) {
        was_esni = 0;
        client_hs_prop.client.esni_keys = ptls_iovec_init(ESNIKEYS, sizeof(ESNIKEYS) - 1);
    }

    switch (mode) {
    case TEST_HANDSHAKE_HRR:
        client_hs_prop.client.negotiate_before_key_exchange = 1;
        break;
    case TEST_HANDSHAKE_HRR_STATELESS:
        client_hs_prop.client.negotiate_before_key_exchange = 1;
        server_hs_prop.server.cookie.key = "0123456789abcdef0123456789abcdef0123456789abcdef";
        server_hs_prop.server.retry_uses_cookie = 1;
        break;
    case TEST_HANDSHAKE_EARLY_DATA:
        assert(ctx_peer->max_early_data_size != 0);
        client_hs_prop.client.max_early_data_size = &max_early_data_size;
        break;
    }

    ret = ptls_handshake(client, &cbuf, NULL, NULL, &client_hs_prop);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(cbuf.off != 0);

    switch (mode) {
    case TEST_HANDSHAKE_2RTT:
    case TEST_HANDSHAKE_HRR:
    case TEST_HANDSHAKE_HRR_STATELESS:
        consumed = cbuf.off;
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, &server_hs_prop);
        if (mode == TEST_HANDSHAKE_HRR_STATELESS) {
            ok(ret == PTLS_ERROR_STATELESS_RETRY);
            ptls_free(server);
            server = ptls_new(ctx_peer, 1);
        } else {
            ok(ret == PTLS_ERROR_IN_PROGRESS);
        }
        ok(cbuf.off == consumed);
        ok(sbuf.off != 0);
        cbuf.off = 0;
        consumed = sbuf.off;
        ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, &client_hs_prop);
        ok(ret == PTLS_ERROR_IN_PROGRESS);
        ok(sbuf.off == consumed);
        ok(cbuf.off != 0);
        sbuf.off = 0;
        break;
    case TEST_HANDSHAKE_EARLY_DATA:
        ok(max_early_data_size == ctx_peer->max_early_data_size);
        ret = ptls_send(client, &cbuf, req, strlen(req));
        ok(ret == 0);
        break;
    }

    consumed = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, &server_hs_prop);

    if (require_client_authentication == 1) {
        ok(ptls_is_psk_handshake(server) == 0);
        ok(ret == PTLS_ERROR_IN_PROGRESS);
    } else {
        ok(ret == 0);
    }

    ok(sbuf.off != 0);
    if (check_ch) {
        ok(ptls_get_server_name(server) != NULL);
        ok(strcmp(ptls_get_server_name(server), "test.example.com") == 0);
        ok(ptls_get_negotiated_protocol(server) != NULL);
        ok(strcmp(ptls_get_negotiated_protocol(server), "h2") == 0);
        ok(was_esni == (ctx_peer->esni != NULL));
    } else {
        ok(ptls_get_server_name(server) == NULL);
        ok(ptls_get_negotiated_protocol(server) == NULL);
    }

    if (mode == TEST_HANDSHAKE_EARLY_DATA && require_client_authentication == 0) {
        ok(consumed < cbuf.off);
        memmove(cbuf.base, cbuf.base + consumed, cbuf.off - consumed);
        cbuf.off -= consumed;

        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        ok(decbuf.off == strlen(req));
        ok(memcmp(decbuf.base, req, decbuf.off) == 0);
        ok(!ptls_handshake_is_complete(server));
        cbuf.off = 0;
        decbuf.off = 0;

        ret = ptls_send(server, &sbuf, resp, strlen(resp));
        ok(ret == 0);
    } else {
        ok(consumed == cbuf.off);
        cbuf.off = 0;
    }

    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    ok(ret == 0);
    ok(cbuf.off != 0);
    if (check_ch) {
        ok(ptls_get_server_name(client) != NULL);
        ok(strcmp(ptls_get_server_name(client), "test.example.com") == 0);
        ok(ptls_get_negotiated_protocol(client) != NULL);
        ok(strcmp(ptls_get_negotiated_protocol(client), "h2") == 0);
    } else {
        ok(ptls_get_server_name(server) == NULL);
        ok(ptls_get_negotiated_protocol(server) == NULL);
    }

    if (expect_ticket) {
        ok(consumed < sbuf.off);
        memmove(sbuf.base, sbuf.base + consumed, sbuf.off - consumed);
        sbuf.off -= consumed;
    } else {
        ok(consumed == sbuf.off);
        sbuf.off = 0;
    }

    if (require_client_authentication == 1) {
        ok(!ptls_handshake_is_complete(server));
        consumed = cbuf.off;
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, &server_hs_prop);
        ok(ret == 0);
        ok(ptls_handshake_is_complete(server));
        cbuf.off = 0;
    }

    if (mode != TEST_HANDSHAKE_EARLY_DATA || require_client_authentication == 1) {
        ret = ptls_send(client, &cbuf, req, strlen(req));
        ok(ret == 0);

        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        ok(decbuf.off == strlen(req));
        ok(memcmp(decbuf.base, req, strlen(req)) == 0);
        ok(ptls_handshake_is_complete(server));
        decbuf.off = 0;
        cbuf.off = 0;

        ret = ptls_send(server, &sbuf, resp, strlen(resp));
        ok(ret == 0);
    }

    consumed = sbuf.off;
    ret = ptls_receive(client, &decbuf, sbuf.base, &consumed);
    ok(ret == 0);
    ok(consumed == sbuf.off);
    ok(decbuf.off == strlen(resp));
    ok(memcmp(decbuf.base, resp, strlen(resp)) == 0);
    ok(ptls_handshake_is_complete(client));
    decbuf.off = 0;
    sbuf.off = 0;

    if (mode == TEST_HANDSHAKE_EARLY_DATA) {
        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(cbuf.off == consumed);
        ok(decbuf.off == 0);
        ok(ptls_handshake_is_complete(client));
        cbuf.off = 0;
    }

    if (mode == TEST_HANDSHAKE_KEY_UPDATE) {
        /* server -> client with update_request */
        ret = ptls_update_key(server, 1);
        ok(ret == 0);
        ok(server->needs_key_update);
        ok(server->key_update_send_request);
        ret = ptls_send(server, &sbuf, "good bye", 8);
        ok(ret == 0);
        ok(!server->needs_key_update);
        ok(!server->key_update_send_request);
        consumed = sbuf.off;
        ret = ptls_receive(client, &decbuf, sbuf.base, &consumed);
        ok(ret == 0);
        ok(sbuf.off == consumed);
        ok(decbuf.off == 8);
        ok(memcmp(decbuf.base, "good bye", 8) == 0);
        ok(client->needs_key_update);
        ok(!client->key_update_send_request);
        sbuf.off = 0;
        decbuf.off = 0;
        ret = ptls_send(client, &cbuf, "hello", 5);
        ok(ret == 0);
        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(cbuf.off == consumed);
        ok(decbuf.off == 5);
        ok(memcmp(decbuf.base, "hello", 5) == 0);
        cbuf.off = 0;
        decbuf.off = 0;
    }

    ptls_buffer_dispose(&cbuf);
    ptls_buffer_dispose(&sbuf);
    ptls_buffer_dispose(&decbuf);
    ptls_free(client);
    ptls_free(server);

    if (check_ch)
        ctx_peer->on_client_hello = NULL;

    ctx->verify_certificate = NULL;
    if (require_client_authentication)
        ctx_peer->require_client_authentication = 0;
}